

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChFunction_Base.cpp
# Opt level: O2

int __thiscall
chrono::ChFunction::FileAsciiPairsSave
          (ChFunction *this,ChStreamOutAscii *m_file,double mxmin,double mxmax,int msamples)

{
  ChException *pCVar1;
  bool bVar2;
  double dVal;
  allocator local_99;
  double local_98;
  double local_90;
  string local_88;
  string local_68;
  string local_48;
  
  if (msamples < 2) {
    pCVar1 = (ChException *)__cxa_allocate_exception(0x28);
    std::__cxx11::string::string
              ((string *)&local_48,
               "Warning! too short range or too long sampling period: no points can be saved",
               &local_99);
    ChException::ChException(pCVar1,&local_48);
    __cxa_throw(pCVar1,&ChException::typeinfo,ChException::~ChException);
  }
  if ((uint)msamples < 100000) {
    local_98 = mxmin;
    local_90 = mxmax;
    if (mxmin < mxmax) {
      ChStreamOutAscii::SetNumFormat(m_file,"%0.8f");
      local_90 = (local_90 - local_98) / ((double)msamples + -1.0);
      while (bVar2 = msamples != 0, msamples = msamples + -1, bVar2) {
        ChStreamOutAscii::operator<<(m_file,local_98);
        ChStreamOutAscii::operator<<(m_file,"    ");
        dVal = local_98;
        (*this->_vptr_ChFunction[4])(this);
        ChStreamOutAscii::operator<<(m_file,dVal);
        ChStreamOutAscii::CR(m_file);
        local_98 = local_98 + local_90;
      }
      return 1;
    }
    pCVar1 = (ChException *)__cxa_allocate_exception(0x28);
    std::__cxx11::string::string
              ((string *)&local_88,"Warning! Cannot save ChFunction if Xmax < Xmin",&local_99);
    ChException::ChException(pCVar1,&local_88);
    __cxa_throw(pCVar1,&ChException::typeinfo,ChException::~ChException);
  }
  pCVar1 = (ChException *)__cxa_allocate_exception(0x28);
  std::__cxx11::string::string
            ((string *)&local_68,"Warning! Too many points should be saved",&local_99);
  ChException::ChException(pCVar1,&local_68);
  __cxa_throw(pCVar1,&ChException::typeinfo,ChException::~ChException);
}

Assistant:

int ChFunction::FileAsciiPairsSave(ChStreamOutAscii& m_file, double mxmin, double mxmax, int msamples) {
    if (msamples <= 1)
        throw(ChException("Warning! too short range or too long sampling period: no points can be saved"));
    if (msamples >= 100000)
        throw(ChException("Warning! Too many points should be saved"));
    if (mxmax <= mxmin)
        throw(ChException("Warning! Cannot save ChFunction if Xmax < Xmin"));

    m_file.SetNumFormat("%0.8f");

    double period = (mxmax - mxmin) / ((double)msamples - 1);

    double mX = mxmin;
    for (int cnt = 1; cnt <= msamples; cnt++) {
        m_file << mX;
        m_file << "    ";
        m_file << this->Get_y(mX);
        m_file.CR();
        mX += period;
    }
    return 1;
}